

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O0

int find_interp_filter_in_stats
              (MB_MODE_INFO *mbmi,INTERPOLATION_FILTER_STATS *interp_filter_stats,
              int interp_filter_stats_idx,int skip_level)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  MB_MODE_INFO *in_RDI;
  int mv_diff;
  INTERPOLATION_FILTER_STATS *st;
  int j;
  int match;
  int best;
  int is_comp;
  int thr [2] [2];
  int in_stack_ffffffffffffffac;
  int iVar2;
  int iVar3;
  int local_40;
  int local_38 [6];
  int local_20;
  int local_1c;
  long local_18;
  MB_MODE_INFO *local_10;
  int local_4;
  
  local_38[0] = 0;
  local_38[1] = 0;
  local_38[2] = 3;
  local_38[3] = 7;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = has_second_ref(in_RDI);
  local_40 = 0x7fffffff;
  iVar3 = -1;
  iVar2 = 0;
  while ((local_4 = iVar3, iVar2 < local_1c &&
         (in_stack_ffffffffffffffac =
               is_interp_filter_good_match
                         ((INTERPOLATION_FILTER_STATS *)CONCAT44(iVar3,iVar2),
                          (MB_MODE_INFO *)(local_18 + (long)iVar2 * 0x28),in_stack_ffffffffffffffac)
         , local_4 = iVar2, in_stack_ffffffffffffffac != 0))) {
    if ((in_stack_ffffffffffffffac < local_40) &&
       (in_stack_ffffffffffffffac <= local_38[(long)(local_20 + -1) * 2 + (long)iVar1])) {
      iVar3 = iVar2;
      local_40 = in_stack_ffffffffffffffac;
    }
    iVar2 = iVar2 + 1;
  }
  if (local_4 == -1) {
    local_4 = -1;
  }
  else {
    local_10->interp_filters = *(int_interpfilters *)(local_18 + (long)local_4 * 0x28);
  }
  return local_4;
}

Assistant:

static inline int find_interp_filter_in_stats(
    MB_MODE_INFO *const mbmi, INTERPOLATION_FILTER_STATS *interp_filter_stats,
    int interp_filter_stats_idx, int skip_level) {
  // [skip_levels][single or comp]
  const int thr[2][2] = { { 0, 0 }, { 3, 7 } };
  const int is_comp = has_second_ref(mbmi);

  // Find good enough match.
  // TODO(yunqing): Separate single-ref mode and comp mode stats for fast
  // search.
  int best = INT_MAX;
  int match = -1;
  for (int j = 0; j < interp_filter_stats_idx; ++j) {
    const INTERPOLATION_FILTER_STATS *st = &interp_filter_stats[j];
    const int mv_diff = is_interp_filter_good_match(st, mbmi, skip_level);
    // Exact match is found.
    if (mv_diff == 0) {
      match = j;
      break;
    } else if (mv_diff < best && mv_diff <= thr[skip_level - 1][is_comp]) {
      best = mv_diff;
      match = j;
    }
  }

  if (match != -1) {
    mbmi->interp_filters = interp_filter_stats[match].filters;
    return match;
  }
  return -1;  // no match result found
}